

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPU4StateImpl<float,_1,_0>::calcEdgeLogLikelihoods
          (BeagleCPU4StateImpl<float,_1,_0> *this,int parIndex,int childIndex,int probIndex,
          int categoryWeightsIndex,int stateFrequenciesIndex,int scalingFactorsIndex,
          double *outSumLogLikelihood)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  int iVar22;
  int iVar23;
  float *pfVar24;
  float *pfVar25;
  int *piVar26;
  float *pfVar27;
  float *pfVar28;
  double *pdVar29;
  uint uVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  ulong uVar34;
  long lVar35;
  int iVar36;
  int iVar37;
  uint uVar38;
  long lVar39;
  float *pfVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  double dVar45;
  undefined1 in_XMM24 [16];
  
  pfVar24 = (this->super_BeagleCPUImpl<float,_1,_0>).gPartials[parIndex];
  pfVar40 = (this->super_BeagleCPUImpl<float,_1,_0>).gTransitionMatrices[probIndex];
  pfVar25 = (this->super_BeagleCPUImpl<float,_1,_0>).gCategoryWeights[categoryWeightsIndex];
  memset((this->super_BeagleCPUImpl<float,_1,_0>).integrationTmp,0,
         (long)(this->super_BeagleCPUImpl<float,_1,_0>).kStateCount *
         (long)(this->super_BeagleCPUImpl<float,_1,_0>).kPatternCount * 4);
  if ((childIndex < (this->super_BeagleCPUImpl<float,_1,_0>).kTipCount) &&
     (piVar26 = (this->super_BeagleCPUImpl<float,_1,_0>).gTipStates[childIndex],
     piVar26 != (int *)0x0)) {
    lVar31 = (long)(this->super_BeagleCPUImpl<float,_1,_0>).kCategoryCount;
    uVar30 = (this->super_BeagleCPUImpl<float,_1,_0>).kPatternCount;
    if (0 < lVar31) {
      iVar22 = (this->super_BeagleCPUImpl<float,_1,_0>).kExtraPatterns;
      pfVar27 = (this->super_BeagleCPUImpl<float,_1,_0>).integrationTmp;
      lVar35 = 0;
      iVar36 = 0;
      iVar37 = 0;
      do {
        if (0 < (int)uVar30) {
          fVar1 = pfVar25[lVar35];
          lVar39 = 0;
          do {
            iVar23 = *(int *)((long)piVar26 + lVar39);
            auVar41 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar23 + iVar37] *
                                                    pfVar24[iVar36 + lVar39])),ZEXT416((uint)fVar1),
                                      ZEXT416((uint)pfVar27[lVar39]));
            pfVar27[lVar39] = auVar41._0_4_;
            auVar41 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar37 + 5 + iVar23] *
                                                    pfVar24[(long)iVar36 + lVar39 + 1])),
                                      ZEXT416((uint)fVar1),ZEXT416((uint)pfVar27[lVar39 + 1]));
            pfVar27[lVar39 + 1] = auVar41._0_4_;
            auVar41 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar37 + 10 + iVar23] *
                                                    pfVar24[(long)iVar36 + lVar39 + 2])),
                                      ZEXT416((uint)fVar1),ZEXT416((uint)pfVar27[lVar39 + 2]));
            pfVar27[lVar39 + 2] = auVar41._0_4_;
            auVar41 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar23 + iVar37 + 0xf] *
                                                    pfVar24[(long)iVar36 + lVar39 + 3])),
                                      ZEXT416((uint)fVar1),ZEXT416((uint)pfVar27[lVar39 + 3]));
            pfVar27[lVar39 + 3] = auVar41._0_4_;
            lVar39 = lVar39 + 4;
          } while ((ulong)uVar30 * 4 - lVar39 != 0);
          iVar36 = iVar36 + (int)lVar39;
        }
        iVar36 = iVar36 + iVar22 * 4;
        iVar37 = iVar37 + 0x14;
        lVar35 = lVar35 + 1;
      } while (lVar35 != lVar31);
    }
  }
  else {
    lVar31 = (long)(this->super_BeagleCPUImpl<float,_1,_0>).kCategoryCount;
    uVar30 = (this->super_BeagleCPUImpl<float,_1,_0>).kPatternCount;
    if (0 < lVar31) {
      pfVar27 = (this->super_BeagleCPUImpl<float,_1,_0>).integrationTmp;
      lVar35 = 0;
      lVar39 = 0;
      iVar36 = 0;
      pfVar28 = (this->super_BeagleCPUImpl<float,_1,_0>).gPartials[childIndex];
      iVar22 = (this->super_BeagleCPUImpl<float,_1,_0>).kPaddedPatternCount;
      do {
        if (0 < (int)uVar30) {
          fVar1 = pfVar40[lVar39];
          fVar19 = pfVar40[lVar39 + 1];
          fVar20 = pfVar40[lVar39 + 2];
          fVar21 = pfVar40[lVar39 + 3];
          fVar2 = pfVar40[lVar39 + 5];
          fVar3 = pfVar40[lVar39 + 6];
          fVar4 = pfVar40[lVar39 + 7];
          fVar5 = pfVar40[lVar39 + 8];
          fVar6 = pfVar40[lVar39 + 10];
          fVar7 = pfVar40[lVar39 + 0xb];
          fVar8 = pfVar40[lVar39 + 0xc];
          fVar9 = pfVar40[lVar39 + 0xd];
          fVar10 = pfVar40[lVar39 + 0xf];
          fVar11 = pfVar40[lVar39 + 0x10];
          fVar12 = pfVar40[lVar39 + 0x11];
          fVar13 = pfVar40[lVar39 + 0x12];
          lVar32 = (long)iVar36;
          fVar14 = pfVar25[lVar35];
          lVar33 = 0xc;
          uVar38 = uVar30;
          do {
            uVar15 = *(uint *)((long)pfVar28 + lVar33 + lVar32 * 4 + -8);
            uVar16 = *(uint *)((long)pfVar28 + lVar33 + lVar32 * 4 + -0xc);
            uVar17 = *(uint *)((long)pfVar28 + lVar33 + lVar32 * 4 + -4);
            uVar18 = *(uint *)((long)pfVar28 + lVar33 + lVar32 * 4);
            auVar41 = vmulss_avx512f(ZEXT416((uint)fVar19),ZEXT416(uVar15));
            auVar42 = vmulss_avx512f(ZEXT416((uint)fVar3),ZEXT416(uVar15));
            auVar44 = vmulss_avx512f(ZEXT416((uint)fVar7),ZEXT416(uVar15));
            auVar43 = vmulss_avx512f(ZEXT416((uint)fVar11),ZEXT416(uVar15));
            auVar41 = vfmadd231ss_avx512f(auVar41,ZEXT416((uint)fVar1),ZEXT416(uVar16));
            auVar42 = vfmadd231ss_avx512f(auVar42,ZEXT416((uint)fVar2),ZEXT416(uVar16));
            auVar44 = vfmadd231ss_avx512f(auVar44,ZEXT416((uint)fVar6),ZEXT416(uVar16));
            auVar43 = vfmadd231ss_avx512f(auVar43,ZEXT416((uint)fVar10),ZEXT416(uVar16));
            auVar41 = vfmadd231ss_avx512f(auVar41,ZEXT416((uint)fVar20),ZEXT416(uVar17));
            auVar42 = vfmadd231ss_avx512f(auVar42,ZEXT416((uint)fVar4),ZEXT416(uVar17));
            auVar44 = vfmadd231ss_avx512f(auVar44,ZEXT416((uint)fVar8),ZEXT416(uVar17));
            auVar43 = vfmadd231ss_avx512f(auVar43,ZEXT416((uint)fVar12),ZEXT416(uVar17));
            auVar41 = vfmadd231ss_avx512f(auVar41,ZEXT416((uint)fVar21),ZEXT416(uVar18));
            auVar41 = vmulss_avx512f(auVar41,ZEXT416(*(uint *)((long)pfVar24 +
                                                              lVar33 + lVar32 * 4 + -0xc)));
            auVar42 = vfmadd231ss_avx512f(auVar42,ZEXT416((uint)fVar5),ZEXT416(uVar18));
            auVar44 = vfmadd231ss_avx512f(auVar44,ZEXT416((uint)fVar9),ZEXT416(uVar18));
            auVar43 = vfmadd231ss_avx512f(auVar43,ZEXT416((uint)fVar13),ZEXT416(uVar18));
            auVar41 = vfmadd213ss_avx512f(auVar41,ZEXT416((uint)fVar14),
                                          ZEXT416(*(uint *)((long)pfVar27 + lVar33 + -0xc)));
            *(int *)((long)pfVar27 + lVar33 + -0xc) = auVar41._0_4_;
            auVar41 = vmulss_avx512f(auVar42,ZEXT416(*(uint *)((long)pfVar24 +
                                                              lVar33 + lVar32 * 4 + -8)));
            auVar41 = vfmadd213ss_avx512f(auVar41,ZEXT416((uint)fVar14),
                                          ZEXT416(*(uint *)((long)pfVar27 + lVar33 + -8)));
            *(int *)((long)pfVar27 + lVar33 + -8) = auVar41._0_4_;
            auVar41 = vmulss_avx512f(auVar44,ZEXT416(*(uint *)((long)pfVar24 +
                                                              lVar33 + lVar32 * 4 + -4)));
            auVar41 = vfmadd213ss_avx512f(auVar41,ZEXT416((uint)fVar14),
                                          ZEXT416(*(uint *)((long)pfVar27 + lVar33 + -4)));
            *(int *)((long)pfVar27 + lVar33 + -4) = auVar41._0_4_;
            auVar41 = vmulss_avx512f(auVar43,ZEXT416(*(uint *)((long)pfVar24 + lVar33 + lVar32 * 4))
                                    );
            auVar41 = vfmadd213ss_avx512f(auVar41,ZEXT416((uint)fVar14),
                                          ZEXT416(*(uint *)((long)pfVar27 + lVar33)));
            *(int *)((long)pfVar27 + lVar33) = auVar41._0_4_;
            lVar33 = lVar33 + 0x10;
            uVar38 = uVar38 - 1;
          } while (uVar38 != 0);
        }
        lVar39 = lVar39 + 0x14;
        lVar35 = lVar35 + 1;
        iVar36 = iVar36 + iVar22 * 4;
      } while (lVar35 != lVar31);
    }
  }
  if (0 < (int)uVar30) {
    lVar31 = 0;
    pfVar24 = (this->super_BeagleCPUImpl<float,_1,_0>).gStateFrequencies[stateFrequenciesIndex];
    pfVar40 = (this->super_BeagleCPUImpl<float,_1,_0>).integrationTmp + 3;
    fVar1 = pfVar24[1];
    fVar19 = *pfVar24;
    fVar20 = pfVar24[2];
    fVar21 = pfVar24[3];
    do {
      auVar41 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * pfVar40[-2])),ZEXT416((uint)fVar19),
                                ZEXT416((uint)pfVar40[-3]));
      auVar41 = vfmadd231ss_fma(auVar41,ZEXT416((uint)fVar20),ZEXT416((uint)pfVar40[-1]));
      auVar41 = vfmadd231ss_fma(auVar41,ZEXT416((uint)fVar21),ZEXT416((uint)*pfVar40));
      dVar45 = log((double)auVar41._0_4_);
      pfVar40 = pfVar40 + 4;
      (this->super_BeagleCPUImpl<float,_1,_0>).outLogLikelihoodsTmp[lVar31] = (float)dVar45;
      lVar31 = lVar31 + 1;
      uVar30 = (this->super_BeagleCPUImpl<float,_1,_0>).kPatternCount;
    } while (lVar31 < (int)uVar30);
  }
  if (scalingFactorsIndex != -1) {
    if ((int)uVar30 < 1) {
      *outSumLogLikelihood = 0.0;
      return 0;
    }
    uVar34 = 0;
    pfVar24 = (this->super_BeagleCPUImpl<float,_1,_0>).gScaleBuffers[scalingFactorsIndex];
    pfVar40 = (this->super_BeagleCPUImpl<float,_1,_0>).outLogLikelihoodsTmp;
    do {
      pfVar40[uVar34] = pfVar24[uVar34] + pfVar40[uVar34];
      uVar34 = uVar34 + 1;
    } while (uVar30 != uVar34);
  }
  *outSumLogLikelihood = 0.0;
  if ((int)uVar30 < 1) {
    return 0;
  }
  pdVar29 = (this->super_BeagleCPUImpl<float,_1,_0>).gPatternWeights;
  pfVar24 = (this->super_BeagleCPUImpl<float,_1,_0>).outLogLikelihoodsTmp;
  auVar41 = ZEXT816(0) << 0x40;
  uVar34 = 0;
  do {
    auVar44 = vcvtss2sd_avx512f(in_XMM24,ZEXT416((uint)pfVar24[uVar34]));
    auVar42._8_8_ = 0;
    auVar42._0_8_ = pdVar29[uVar34];
    auVar41 = vfmadd231sd_fma(auVar41,auVar44,auVar42);
    uVar34 = uVar34 + 1;
    dVar45 = auVar41._0_8_;
    *outSumLogLikelihood = dVar45;
  } while (uVar30 != uVar34);
  return (uint)(!NAN(dVar45) && !NAN(dVar45)) * 8 + -8;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoods(const int parIndex,
                                                           const int childIndex,
                                                           const int probIndex,
                                                           const int categoryWeightsIndex,
                                                           const int stateFrequenciesIndex,
                                                           const int scalingFactorsIndex,
                                                           double* outSumLogLikelihood) {
    // TODO: implement derivatives for calculateEdgeLnL

    assert(parIndex >= kTipCount);

    const REALTYPE* partialsParent = gPartials[parIndex];
    const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
    const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];


    memset(integrationTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));

    if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

        const int* statesChild = gTipStates[childIndex];
        int v = 0; // Index for parent partials
        int w = 0;
        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0; // Index in resulting product-partials (summed over categories)
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {

                const int stateChild = statesChild[k];

                integrationTmp[u    ] += transMatrix[w            + stateChild] * partialsParent[v    ] * weight;
                integrationTmp[u + 1] += transMatrix[w + OFFSET*1 + stateChild] * partialsParent[v + 1] * weight;
                integrationTmp[u + 2] += transMatrix[w + OFFSET*2 + stateChild] * partialsParent[v + 2] * weight;
                integrationTmp[u + 3] += transMatrix[w + OFFSET*3 + stateChild] * partialsParent[v + 3] * weight;

                u += 4;
                v += 4;
            }
            w += OFFSET*4;
            if (kExtraPatterns)
            	v += 4 * kExtraPatterns;
        }

    } else { // Integrate against a partial at the child

        const REALTYPE* partialsChild = gPartials[childIndex];
		#if 0//
        int v = 0;
		#endif
        int w = 0;
        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0;
			#if 1//
			int v = l*kPaddedPatternCount*4;
			#endif
            const REALTYPE weight = wt[l];

            PREFETCH_MATRIX(1,transMatrix,w);

            for(int k = 0; k < kPatternCount; k++) {

                const REALTYPE* partials1 = partialsChild;

                PREFETCH_PARTIALS(1,partials1,v);

                DO_INTEGRATION(1);

                integrationTmp[u    ] += sum10 * partialsParent[v    ] * weight;
                integrationTmp[u + 1] += sum11 * partialsParent[v + 1] * weight;
                integrationTmp[u + 2] += sum12 * partialsParent[v + 2] * weight;
                integrationTmp[u + 3] += sum13 * partialsParent[v + 3] * weight;

                u += 4;
                v += 4;
            }
            w += OFFSET*4;
			#if 0//
            if (kExtraPatterns)
            	v += 4 * kExtraPatterns;
			#endif//
        }
    }

    return integrateOutStatesAndScale(integrationTmp, stateFrequenciesIndex, scalingFactorsIndex, outSumLogLikelihood);
}